

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  ImVec2 IVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  float local_8c;
  uint local_74;
  float char_width;
  uint c;
  char *prev_s;
  char **ppcStack_60;
  char c_1;
  char *s;
  char *word_wrap_eol;
  float fStack_48;
  bool word_wrap_enabled;
  float line_width;
  float scale;
  float line_height;
  char **remaining_local;
  char *text_end_local;
  char *text_begin_local;
  float local_20;
  float wrap_width_local;
  float max_width_local;
  float size_local;
  ImFont *this_local;
  ImVec2 text_size;
  
  _scale = remaining;
  remaining_local = (char **)text_end;
  text_end_local = text_begin;
  text_begin_local._4_4_ = wrap_width;
  local_20 = max_width;
  wrap_width_local = size;
  _max_width_local = this;
  if (text_end == (char *)0x0) {
    sVar4 = strlen(text_begin);
    remaining_local = (char **)(text_begin + sVar4);
  }
  line_width = wrap_width_local;
  fStack_48 = wrap_width_local / this->FontSize;
  ImVec2::ImVec2((ImVec2 *)&this_local,0.0,0.0);
  word_wrap_eol._4_4_ = 0.0;
  word_wrap_eol._3_1_ = 0.0 < text_begin_local._4_4_;
  s = (char *)0x0;
  ppcStack_60 = (char **)text_end_local;
LAB_00155a7f:
  do {
    if (remaining_local <= ppcStack_60) {
LAB_00155c88:
      if (this_local._0_4_ < word_wrap_eol._4_4_) {
        this_local._0_4_ = word_wrap_eol._4_4_;
      }
      if ((0.0 < word_wrap_eol._4_4_) || ((this_local._4_4_ == 0.0 && (!NAN(this_local._4_4_))))) {
        this_local._4_4_ = line_width + this_local._4_4_;
      }
      if (_scale != (char **)0x0) {
        *_scale = (char *)ppcStack_60;
      }
      IVar1.y = this_local._4_4_;
      IVar1.x = this_local._0_4_;
      return IVar1;
    }
    if ((word_wrap_eol._3_1_ & 1) == 0) {
LAB_00155b72:
      _char_width = ppcStack_60;
      local_74 = (uint)*(char *)ppcStack_60;
      if (local_74 < 0x80) {
        ppcStack_60 = (char **)((long)ppcStack_60 + 1);
      }
      else {
        iVar3 = ImTextCharFromUtf8(&local_74,(char *)ppcStack_60,(char *)remaining_local);
        ppcStack_60 = (char **)((long)ppcStack_60 + (long)iVar3);
        if (local_74 == 0) goto LAB_00155c88;
      }
      if (local_74 < 0x20) {
        if (local_74 == 10) {
          this_local._0_4_ = ImMax<float>(this_local._0_4_,word_wrap_eol._4_4_);
          this_local._4_4_ = line_width + this_local._4_4_;
          word_wrap_eol._4_4_ = 0.0;
          goto LAB_00155a7f;
        }
        if (local_74 == 0xd) goto LAB_00155a7f;
      }
      if ((int)local_74 < (this->IndexAdvanceX).Size) {
        local_8c = (this->IndexAdvanceX).Data[local_74];
      }
      else {
        local_8c = this->FallbackAdvanceX;
      }
      if (local_20 <= word_wrap_eol._4_4_ + local_8c * fStack_48) {
        ppcStack_60 = _char_width;
        goto LAB_00155c88;
      }
      word_wrap_eol._4_4_ = local_8c * fStack_48 + word_wrap_eol._4_4_;
      goto LAB_00155a7f;
    }
    if ((s == (char *)0x0) &&
       (s = CalcWordWrapPositionA
                      (this,fStack_48,(char *)ppcStack_60,(char *)remaining_local,
                       text_begin_local._4_4_ - word_wrap_eol._4_4_), (char **)s == ppcStack_60)) {
      s = (char *)((long)s + 1);
    }
    if (ppcStack_60 < s) goto LAB_00155b72;
    if (this_local._0_4_ < word_wrap_eol._4_4_) {
      this_local._0_4_ = word_wrap_eol._4_4_;
    }
    this_local._4_4_ = line_width + this_local._4_4_;
    word_wrap_eol._4_4_ = 0.0;
    s = (char *)0x0;
    for (; ppcStack_60 < remaining_local; ppcStack_60 = (char **)((long)ppcStack_60 + 1)) {
      prev_s._7_1_ = *(char *)ppcStack_60;
      bVar2 = ImCharIsBlankA(prev_s._7_1_);
      if (!bVar2) {
        if (prev_s._7_1_ == '\n') {
          ppcStack_60 = (char **)((long)ppcStack_60 + 1);
        }
        break;
      }
    }
  } while( true );
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0,0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}